

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::ModuleAnalyzer::canChangeState::Walker::Walker(Walker *this)

{
  Walker *this_local;
  
  PostWalker<Walker,_wasm::Visitor<Walker,_void>_>::PostWalker
            (&this->super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>);
  this->hasIndirectCall = false;
  this->canChangeState = false;
  this->isBottomMostRuntime = false;
  return;
}

Assistant:

void visitCall(Call* curr) {
        // We only implement these at the very end, but we know that they
        // definitely change the state.
        if (curr->target == ASYNCIFY_START_UNWIND ||
            curr->target == ASYNCIFY_STOP_REWIND ||
            curr->target == ASYNCIFY_GET_CALL_INDEX ||
            curr->target == ASYNCIFY_CHECK_CALL_INDEX) {
          canChangeState = true;
          return;
        }
        if (curr->target == ASYNCIFY_STOP_UNWIND ||
            curr->target == ASYNCIFY_START_REWIND) {
          isBottomMostRuntime = true;
          return;
        }
        // The target may not exist if it is one of our temporary intrinsics.
        auto* target = module->getFunctionOrNull(curr->target);
        if (target && (*map)[target].canChangeState) {
          canChangeState = true;
        }
      }